

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Struct * __thiscall hdc::Parser::parse_struct(Parser *this)

{
  Token *pTVar1;
  bool bVar2;
  Struct *this_00;
  IdentifierExpression *parent;
  Type *type;
  StructField *this_01;
  Token name;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  this_00 = (Struct *)operator_new(0x78);
  Struct::Struct(this_00);
  expect(this,TK_STRUCT);
  expect(this,TK_ID);
  Struct::setName(this_00,(this->matched)._M_current);
  bVar2 = match(this,TK_LEFT_PARENTHESIS);
  if (bVar2) {
    parent = parse_identifier_expression(this);
    Struct::setSuperStruct(this_00,parent);
    expect(this,TK_RIGHT_PARENTHESIS);
  }
  expect(this,TK_COLON);
  expect(this,TK_NEWLINE);
  expect(this,TK_BEGIN);
  bVar2 = match(this,TK_PASS);
  if (!bVar2) {
    while( true ) {
      bVar2 = match(this,TK_ID);
      if (!bVar2) break;
      pTVar1 = (this->matched)._M_current;
      local_60._8_4_ = pTVar1->column;
      local_60._0_4_ = pTVar1->kind;
      local_60._4_4_ = pTVar1->line;
      std::__cxx11::string::_M_assign((string *)&local_50);
      expect(this,TK_COLON);
      type = parse_type(this);
      expect(this,TK_NEWLINE);
      this_01 = (StructField *)operator_new(0x68);
      StructField::StructField(this_01,(Token *)local_60,type);
      Struct::addField(this_00,this_01);
    }
  }
  expect(this,TK_END);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p);
  }
  return this_00;
}

Assistant:

Struct*Parser::parse_struct() {
    Token name;
    Type* type;
    Struct* s = new Struct();

    expect(TK_STRUCT);
    expect(TK_ID);
    s->setName(*matched);

    if (match(TK_LEFT_PARENTHESIS)) {
        s->setSuperStruct(parse_identifier_expression());
        expect(TK_RIGHT_PARENTHESIS);
    }

    expect(TK_COLON);
    expect(TK_NEWLINE);
    expect(TK_BEGIN);

    if (match(TK_PASS)) {

    } else {
        while (match(TK_ID)) {
            name = *matched;
            expect(TK_COLON);
            type = parse_type();
            expect(TK_NEWLINE);
            s->addField(new StructField(name, type));
        }
    }

    expect(TK_END);

    return s;
}